

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::initializeStation(Station *this,int type,int open_apertures)

{
  pointer pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pair<int,_int> pVar6;
  ulong uVar7;
  ulong uVar8;
  int j_1;
  int j;
  int iVar9;
  int i;
  long lVar10;
  int i_3;
  int iVar11;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux;
  pair<int,_int> local_60;
  _Vector_base<int,_std::allocator<int>_> local_58;
  uint local_3c;
  long local_38;
  
  local_3c = type;
  if ((uint)type < 2) {
    for (lVar10 = 0; uVar5 = this->max_apertures, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar9 = 0;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        if (iVar3 <= iVar9) break;
        local_60 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   &local_60);
        iVar9 = iVar9 + 1;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((this->A).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_58);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &local_58);
    }
  }
  else if ((type & 0xfffffffeU) == 2) {
    for (lVar10 = 0; uVar5 = this->max_apertures, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar9 = 0;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        if (iVar3 <= iVar9) break;
        local_60.first = -1;
        local_60.second = -1;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   &local_60);
        iVar9 = iVar9 + 1;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((this->A).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_58);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &local_58);
    }
  }
  else if (type == 4) {
    for (lVar10 = 0; uVar5 = this->max_apertures, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar9 = 0;
      local_38 = lVar10;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        lVar10 = local_38;
        if (iVar3 <= iVar9) break;
        pVar6 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
        iVar3 = pVar6.first;
        if (iVar3 < 0) {
          local_60.first = -1;
          local_60.second = -1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                     &local_60);
        }
        else {
          iVar4 = rand();
          iVar11 = pVar6.second;
          iVar3 = iVar4 % ((iVar11 - iVar3) + 1) + iVar3;
          if (iVar3 == iVar11) {
            local_60 = (pair<int,_int>)((ulong)pVar6 & 0xffffffff00000000 | (ulong)pVar6 >> 0x20);
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       &local_60);
          }
          else {
            iVar4 = rand();
            local_60.second = iVar4 % ((iVar11 - iVar3) + 1) + iVar3;
            local_60.first = iVar3;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       &local_60);
          }
        }
        iVar9 = iVar9 + 1;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((this->A).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_38,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_58);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &local_58);
    }
  }
  else {
    for (lVar10 = 0; uVar5 = this->max_apertures, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar9 = 0;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        if (iVar3 <= iVar9) break;
        if (open_apertures < 1) {
          local_60.first = -1;
          local_60.second = -1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                     &local_60);
        }
        else {
          local_60 = Collimator::getActiveRange(this->collimator,iVar9,this->angle);
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                     &local_60);
        }
        iVar9 = iVar9 + 1;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((this->A).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_58);
      open_apertures = open_apertures + -1;
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &local_58);
    }
  }
  uVar2 = local_3c;
  if ((local_3c & 0xfffffffd) == 0) {
    iVar9 = this->min_intensity;
    pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pdVar1[uVar8] = (double)iVar9;
    }
  }
  else if ((local_3c & 0xfffffffd) == 1) {
    iVar9 = this->max_intensity;
    pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pdVar1[uVar8] = (double)iVar9;
    }
  }
  else if (local_3c == 4) {
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar9 = 0;
    while (local_60.first = iVar9, iVar9 <= this->max_intensity) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_58,&local_60.first);
      iVar9 = this->step_intensity + local_60.first;
    }
    for (lVar10 = 0; lVar10 < this->max_apertures; lVar10 = lVar10 + 1) {
      iVar9 = rand();
      (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] =
           (double)local_58._M_impl.super__Vector_impl_data._M_start
                   [(int)((ulong)(long)iVar9 %
                         (((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2) + 1U))];
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  }
  else {
    iVar9 = this->initial_intensity;
    pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pdVar1[uVar8] = (double)iVar9;
    }
  }
  if (uVar2 == 5) {
    generate_random_intensities(this);
  }
  else {
    generateIntensity(this);
  }
  return;
}

Assistant:

void Station::initializeStation(int type, int open_apertures) {
    // Generating aperture patterns


    if (type==OPEN_MAX_SETUP || type==OPEN_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++){
          aux.push_back(collimator.getActiveRange(j,angle));
        }
	      A[i] =aux;
      }
    } else if (type==CLOSED_MAX_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++){
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++)
          aux.push_back(make_pair(-1,-1));
        A[i] = aux;
      }
    } else if (type==RAND_RAND_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          pair<int, int> range = collimator.getActiveRange(j,angle);
          if (range.first<0) {
            aux.push_back(make_pair(-1,-1));
            continue;
          }
          int index1 = range.first + rand() % (range.second-range.first+1);
          if (index1 == range.second) {
            aux.push_back(make_pair(range.second,range.second));
          } else {
            int index2 = index1 + rand() % (range.second-index1+1);
            aux.push_back(make_pair(index1,index2));
          }
        }
        A[i]=aux;
      }
    } else {
      //Keeping this for backwards compatibility
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          if (open_apertures>0)
            aux.push_back(collimator.getActiveRange(j,angle));
          else
            aux.push_back(make_pair(-1,-1));
        }
        open_apertures--;
        A[i]=aux;
      }
    }

    // Generating intensity
    if (type==OPEN_MIN_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = min_intensity;
    } else if (type==OPEN_MAX_SETUP || type==CLOSED_MAX_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = max_intensity;
    } else if (type==RAND_RAND_SETUP) {
      vector<int> levels;
      for (int k=0; k<=max_intensity; k=k+step_intensity)
        levels.push_back(k);
      int sel;
      for (int i=0; i<max_apertures; i++) {
        sel = (rand() %  (levels.size()+1));
        intensity[i] = levels[sel];
      }
    } else {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = initial_intensity;
    }

    if(type==RAND_INTENSITIES)
      generate_random_intensities();
    else
      generateIntensity();
  }